

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O2

int __thiscall
FPNGTexture::CopyTrueColorPixels
          (FPNGTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  ushort uVar1;
  ushort uVar2;
  FWadLump *__return_storage_ptr__;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar3;
  _func_int **pp_Var4;
  int iVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  long lVar8;
  PalEntry *pPVar9;
  BYTE *pBVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  DWORD len;
  uint local_46c;
  uint local_468;
  DWORD id;
  long local_460;
  undefined8 local_458;
  ulong local_450;
  FBitmap *local_448;
  FCopyInfo *local_440;
  PalEntry pe [256];
  
  uVar1 = (this->super_FTexture).Width;
  local_460 = (long)"\x01"[this->ColorType];
  iVar5 = (this->super_FTexture).SourceLump;
  local_46c = x;
  local_468 = y;
  local_448 = bmp;
  local_440 = inf;
  if (iVar5 < 0) {
    __return_storage_ptr__ = (FWadLump *)this->fr;
  }
  else {
    __return_storage_ptr__ = (FWadLump *)operator_new(0x38);
    FWadCollection::OpenLumpNum(__return_storage_ptr__,&Wads,iVar5);
  }
  local_460 = local_460 * (ulong)uVar1;
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
            (__return_storage_ptr__,0x21,0);
  paVar3 = &pe[0].field_0;
  for (lVar8 = 0; lVar8 != 0x1010100; lVar8 = lVar8 + 0x10101) {
    *paVar3 = (anon_union_4_2_12391d7c_for_PalEntry_0)((uint)lVar8 | 0xff000000);
    paVar3 = paVar3 + 1;
  }
  local_450 = (ulong)(uint)rotate;
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&len,4);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&id,4);
  local_458 = 0;
  while ((lVar8 = local_460, id != 0x444e4549 && (id != 0x54414449))) {
    len = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
    if (id == 0x534e5274) {
      if (this->ColorType != '\x03') goto LAB_004eabf1;
      pBVar10 = &pe[0].field_0.field_0.a;
      for (uVar7 = 0; uVar7 < len; uVar7 = uVar7 + 1) {
        (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                  (__return_storage_ptr__,pBVar10,1);
        if ((*pBVar10 != '\0') && (*pBVar10 != 0xff)) {
          local_458 = 1;
        }
        pBVar10 = pBVar10 + 4;
      }
    }
    else if (id == 0x45544c50) {
      pPVar9 = pe;
      for (lVar8 = 0; lVar8 < this->PaletteSize; lVar8 = lVar8 + 1) {
        (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                  (__return_storage_ptr__,(undefined1 *)((long)&pPVar9->field_0 + 2),1);
        (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                  (__return_storage_ptr__,(undefined1 *)((long)&pPVar9->field_0 + 1),1);
        (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                  (__return_storage_ptr__,pPVar9,1);
        pPVar9 = pPVar9 + 1;
      }
    }
    else {
LAB_004eabf1:
      (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
                (__return_storage_ptr__,(ulong)len,1);
    }
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
              (__return_storage_ptr__,4,1);
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (__return_storage_ptr__,&len,4);
    id = 0x444e4549;
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (__return_storage_ptr__,&id,4);
  }
  if (((this->ColorType == '\0') && (this->HaveTrans == true)) &&
     ((ulong)this->NonPaletteTrans[0] < 0x100)) {
    pe[this->NonPaletteTrans[0]].field_0.field_0.a = '\0';
    local_458 = 1;
  }
  pBVar10 = (BYTE *)operator_new__(local_460 * (ulong)(this->super_FTexture).Height);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
            (__return_storage_ptr__,(ulong)this->StartOfIDAT,0);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&len,4);
  (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (__return_storage_ptr__,&id,4);
  M_ReadIDAT(&__return_storage_ptr__->super_FileReader,pBVar10,(uint)(this->super_FTexture).Width,
             (uint)(this->super_FTexture).Height,(int)lVar8,this->BitDepth,this->ColorType,
             this->Interlace,len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18
            );
  if (__return_storage_ptr__ != (FWadLump *)this->fr) {
    (*(__return_storage_ptr__->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])
              (__return_storage_ptr__);
  }
  switch(this->ColorType) {
  case '\0':
  case '\x03':
    uVar7 = (ulong)(this->super_FTexture).Width;
    (*local_448->_vptr_FBitmap[3])
              (local_448,(ulong)local_46c,(ulong)local_468,pBVar10,uVar7,
               (ulong)(this->super_FTexture).Height,1,uVar7,local_450,pe,local_440);
    break;
  case '\x02':
    uVar7 = (ulong)(this->super_FTexture).Width;
    uVar6 = (ulong)(this->super_FTexture).Height;
    if (this->HaveTrans != false) {
      (*local_448->_vptr_FBitmap[2])
                (local_448,(ulong)local_46c,(ulong)local_468,pBVar10,uVar7,uVar6,3,local_460,
                 local_450,1,local_440,(ulong)this->NonPaletteTrans[0],
                 (ulong)this->NonPaletteTrans[1],(ulong)this->NonPaletteTrans[2]);
      iVar5 = 1;
      goto LAB_004eae29;
    }
    (*local_448->_vptr_FBitmap[2])
              (local_448,(ulong)local_46c,(ulong)local_468,pBVar10,uVar7,uVar6,3,local_460,local_450
               ,0,local_440,0,0,0);
    break;
  case '\x04':
    uVar1 = (this->super_FTexture).Width;
    uVar2 = (this->super_FTexture).Height;
    pp_Var4 = local_448->_vptr_FBitmap;
    uVar12 = 3;
    uVar11 = 2;
    goto LAB_004eae1f;
  case '\x06':
    uVar1 = (this->super_FTexture).Width;
    uVar2 = (this->super_FTexture).Height;
    pp_Var4 = local_448->_vptr_FBitmap;
    uVar12 = 2;
    uVar11 = 4;
LAB_004eae1f:
    (*pp_Var4[2])(local_448,(ulong)local_46c,(ulong)local_468,pBVar10,(ulong)uVar1,(ulong)uVar2,
                  uVar11,local_460,local_450,uVar12,local_440,0,0,0);
    iVar5 = -1;
    goto LAB_004eae29;
  }
  iVar5 = (int)local_458;
LAB_004eae29:
  operator_delete__(pBVar10);
  return iVar5;
}

Assistant:

int FPNGTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	// Parse pre-IDAT chunks. I skip the CRCs. Is that bad?
	PalEntry pe[256];
	DWORD len, id;
	FileReader *lump;
	static char bpp[] = {1, 0, 3, 1, 2, 0, 4};
	int pixwidth = Width * bpp[ColorType];
	int transpal = false;

	if (SourceLump >= 0)
	{
		lump = new FWadLump(Wads.OpenLumpNum(SourceLump));
	}
	else
	{
		lump = fr;// new FileReader(SourceFile.GetChars());
	}

	lump->Seek(33, SEEK_SET);
	for(int i = 0; i < 256; i++)	// default to a gray map
		pe[i] = PalEntry(255,i,i,i);

	lump->Read(&len, 4);
	lump->Read(&id, 4);
	while (id != MAKE_ID('I','D','A','T') && id != MAKE_ID('I','E','N','D'))
	{
		len = BigLong((unsigned int)len);
		switch (id)
		{
		default:
			lump->Seek (len, SEEK_CUR);
			break;

		case MAKE_ID('P','L','T','E'):
			for(int i = 0; i < PaletteSize; i++)
			{
				(*lump) >> pe[i].r >> pe[i].g >> pe[i].b;
			}
			break;

		case MAKE_ID('t','R','N','S'):
			if (ColorType == 3)
			{
				for(DWORD i = 0; i < len; i++)
				{
					(*lump) >> pe[i].a;
					if (pe[i].a != 0 && pe[i].a != 255)
						transpal = true;
				}
			}
			else
			{
				lump->Seek(len, SEEK_CUR);
			}
			break;
		}
		lump->Seek(4, SEEK_CUR);		// Skip CRC
		lump->Read(&len, 4);
		id = MAKE_ID('I','E','N','D');
		lump->Read(&id, 4);
	}

	if (ColorType == 0 && HaveTrans && NonPaletteTrans[0] < 256)
	{
		pe[NonPaletteTrans[0]].a = 0;
		transpal = true;
	}

	BYTE * Pixels = new BYTE[pixwidth * Height];

	lump->Seek (StartOfIDAT, SEEK_SET);
	lump->Read(&len, 4);
	lump->Read(&id, 4);
	M_ReadIDAT (lump, Pixels, Width, Height, pixwidth, BitDepth, ColorType, Interlace, BigLong((unsigned int)len));
	if (lump != fr) delete lump;

	switch (ColorType)
	{
	case 0:
	case 3:
		bmp->CopyPixelData(x, y, Pixels, Width, Height, 1, Width, rotate, pe, inf);
		break;

	case 2:
		if (!HaveTrans)
		{
			bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, pixwidth, rotate, CF_RGB, inf);
		}
		else
		{
			bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, pixwidth, rotate, CF_RGBT, inf,
				NonPaletteTrans[0], NonPaletteTrans[1], NonPaletteTrans[2]);
			transpal = true;
		}
		break;

	case 4:
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 2, pixwidth, rotate, CF_IA, inf);
		transpal = -1;
		break;

	case 6:
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 4, pixwidth, rotate, CF_RGBA, inf);
		transpal = -1;
		break;

	default:
		break;

	}
	delete[] Pixels;
	return transpal;
}